

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.cpp
# Opt level: O3

Audio_formats lossless_neural_sound::audio::Audio_formats::get(void)

{
  return (Audio_formats)ZEXT816(0x1041f0);
}

Assistant:

Audio_formats Audio_formats::get() noexcept
{
    static constexpr const Audio_format *audio_formats[] =
    {
#if AUDIO_HAS_FLAC
        &Flac::audio_format,
#endif
        nullptr,
    };
    constexpr std::size_t terminating_null_format_size = 1;
    return Audio_formats(
        audio_formats,
        sizeof(audio_formats) / sizeof(audio_formats[0]) - terminating_null_format_size);
}